

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O2

bool __thiscall Ratio::containsOriginalEEdge(Ratio *this,Bipartition *edge)

{
  pointer pPVar1;
  bool bVar2;
  pointer pPVar3;
  bool bVar4;
  Bipartition *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  Ratio *local_38;
  
  pPVar3 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_38 = this;
  do {
    if (pPVar3 == pPVar1) {
      pPVar3 = (local_38->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pPVar1 = (local_38->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      do {
        bVar4 = pPVar3 == pPVar1;
        bVar2 = !bVar4;
        if (bVar4) {
          return bVar2;
        }
        PhyloTreeEdge::getOriginalEdge((PhyloTreeEdge *)&local_48);
        bVar4 = Bipartition::equals(local_48,edge);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
        pPVar3 = pPVar3 + 1;
      } while (!bVar4);
      return bVar2;
    }
    PhyloTreeEdge::getOriginalEdge((PhyloTreeEdge *)&local_48);
    bVar2 = Bipartition::equals(local_48,edge);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    pPVar3 = pPVar3 + 1;
  } while (!bVar2);
  return true;
}

Assistant:

bool Ratio::containsOriginalEEdge(const Bipartition &edge) {

    for (PhyloTreeEdge &ratio_edge : eEdges) {
        if (ratio_edge.getOriginalEdge()->equals(edge)) {
            return true;
        }
    }

    for (PhyloTreeEdge &ratio_edge : fEdges) {
        if (ratio_edge.getOriginalEdge()->equals(edge)) {
            return true;
        }
    }
    return false;
}